

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O3

ProKey * __thiscall ProFile::getHashStr(ProKey *__return_storage_ptr__,ProFile *this,ushort **tPtr)

{
  ushort uVar1;
  uint hash;
  uint *puVar2;
  char16_t *pcVar3;
  
  puVar2 = (uint *)*tPtr;
  *tPtr = (ushort *)((long)puVar2 + 2);
  hash = *puVar2;
  *tPtr = (ushort *)((long)puVar2 + 6);
  uVar1 = (ushort)puVar2[1];
  *(undefined1 **)&(__return_storage_ptr__->super_ProString).m_file = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_ProString).m_hash = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_ProString).m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_ProString).m_offset = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_ProString).m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_ProString).m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pcVar3 = (this->m_proitems).d.ptr;
  if (pcVar3 == (char16_t *)0x0) {
    pcVar3 = (char16_t *)&QString::_empty;
  }
  ProKey::ProKey(__return_storage_ptr__,&this->m_proitems,
                 (int)((ulong)((long)puVar2 + (6 - (long)pcVar3)) >> 1),(uint)uVar1,hash);
  *tPtr = (ushort *)((long)*tPtr + (ulong)((uint)uVar1 + (uint)uVar1));
  return __return_storage_ptr__;
}

Assistant:

ProKey ProFile::getHashStr(const ushort *&tPtr)
{
    uint hash = *tPtr++;
    hash |= (uint)*tPtr++ << 16;
    uint len = *tPtr++;
    ProKey ret(items(), tPtr - tokPtr(), len, hash);
    tPtr += len;
    return ret;
}